

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O1

PHYSFS_sint64 zip64_find_end_of_central_dir(PHYSFS_Io *io,PHYSFS_sint64 _pos,PHYSFS_uint64 offset)

{
  _func_int_PHYSFS_Io_ptr_PHYSFS_uint64 *p_Var1;
  bool bVar2;
  int iVar3;
  undefined8 in_RAX;
  void *buf;
  undefined1 *puVar4;
  undefined1 *ptr;
  ulong uVar5;
  int iVar6;
  size_t len;
  undefined1 auStack_38 [4];
  PHYSFS_uint32 local_34 [2];
  PHYSFS_uint32 ui32;
  
  local_34[0] = (PHYSFS_uint32)((ulong)in_RAX >> 0x20);
  puVar4 = auStack_38;
  if (_pos < 1) {
    __assert_fail("_pos > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/REGoth-project[P]physfs/src/physfs_archiver_zip.c"
                  ,0x4aa,
                  "PHYSFS_sint64 zip64_find_end_of_central_dir(PHYSFS_Io *, PHYSFS_sint64, PHYSFS_uint64)"
                 );
  }
  iVar3 = (*io->seek)(io,offset);
  if (iVar3 == 0) {
    return -1;
  }
  iVar3 = readui32(io,local_34);
  if (iVar3 == 0) {
    return -1;
  }
  if (local_34[0] == 0x6064b50) {
    return offset;
  }
  if (0x38 < (ulong)_pos) {
    iVar3 = (*io->seek)(io,_pos - 0x38U);
    if (iVar3 == 0) {
      return -1;
    }
    iVar3 = readui32(io,local_34);
    if (iVar3 == 0) {
      return -1;
    }
    if (local_34[0] == 0x6064b50) {
      return _pos - 0x38U;
    }
  }
  if (0x54 < (ulong)_pos) {
    iVar3 = (*io->seek)(io,_pos - 0x54U);
    if (iVar3 == 0) {
      return -1;
    }
    iVar3 = readui32(io,local_34);
    if (iVar3 == 0) {
      return -1;
    }
    if (local_34[0] == 0x6064b50) {
      return _pos - 0x54U;
    }
  }
  uVar5 = _pos - offset;
  if ((ulong)_pos < 5 || ((ulong)_pos < offset || uVar5 == 0)) goto LAB_00116429;
  len = 0x40000;
  if (uVar5 < 0x40000) {
    len = uVar5;
  }
  if (uVar5 < 0x100) {
    ptr = auStack_38 + -(len + 0x17 & 0xfffffffffffffff0);
    puVar4 = ptr;
  }
  else {
    ptr = (undefined1 *)0x0;
    puVar4 = auStack_38;
  }
  *(undefined8 *)(puVar4 + -8) = 0x11639c;
  buf = __PHYSFS_initSmallAlloc(ptr,len);
  if (buf == (void *)0x0) {
    *(undefined8 *)(puVar4 + -8) = 0x11641c;
    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
LAB_0011641c:
    buf = (void *)0xffffffffffffffff;
    bVar2 = false;
  }
  else {
    p_Var1 = io->seek;
    *(undefined8 *)(puVar4 + -8) = 0x1163b1;
    iVar3 = (*p_Var1)(io,_pos - len);
    if (iVar3 == 0) {
LAB_00116408:
      *(undefined8 *)(puVar4 + -8) = 0x116410;
      __PHYSFS_smallFree(buf);
      goto LAB_0011641c;
    }
    *(undefined8 *)(puVar4 + -8) = 0x1163c3;
    iVar3 = __PHYSFS_readAll(io,buf,len);
    if (iVar3 == 0) goto LAB_00116408;
    if (3 < uVar5) {
      uVar5 = (ulong)((int)len - 4);
      iVar3 = (int)len + -3;
      do {
        if ((((*(char *)((long)buf + uVar5) == 'P') && (*(char *)((long)buf + uVar5 + 1) == 'K')) &&
            (*(char *)((long)buf + uVar5 + 2) == '\x06')) &&
           (*(char *)((long)buf + uVar5 + 3) == '\x06')) {
          *(undefined8 *)(puVar4 + -8) = 0x116454;
          __PHYSFS_smallFree(buf);
          buf = (void *)((_pos - len) + uVar5);
          bVar2 = false;
          goto LAB_00116425;
        }
        uVar5 = uVar5 - 1;
        iVar6 = iVar3 + -1;
        bVar2 = 0 < iVar3;
        iVar3 = iVar6;
      } while (iVar6 != 0 && bVar2);
    }
    *(undefined8 *)(puVar4 + -8) = 0x116404;
    __PHYSFS_smallFree(buf);
    bVar2 = true;
  }
LAB_00116425:
  if (!bVar2) {
    return (PHYSFS_sint64)buf;
  }
LAB_00116429:
  *(undefined8 *)(puVar4 + -8) = 0x116433;
  PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
  return -1;
}

Assistant:

static PHYSFS_sint64 zip64_find_end_of_central_dir(PHYSFS_Io *io,
                                                   PHYSFS_sint64 _pos,
                                                   PHYSFS_uint64 offset)
{
    /*
     * Naturally, the offset is useless to us; it is the offset from the
     *  start of file, which is meaningless if we've appended this .zip to
     *  a self-extracting .exe. We need to find this on our own. It should
     *  be directly before the locator record, but the record in question,
     *  like the original end-of-central-directory record, ends with a
     *  variable-length field. Unlike the original, which has to store the
     *  size of that variable-length field in a 16-bit int and thus has to be
     *  within 64k, the new one gets 64-bits.
     *
     * Fortunately, the only currently-specified record for that variable
     *  length block is some weird proprietary thing that deals with EBCDIC
     *  and tape backups or something. So we don't seek far.
     */

    PHYSFS_uint32 ui32;
    const PHYSFS_uint64 pos = (PHYSFS_uint64) _pos;

    assert(_pos > 0);

    /* Try offset specified in the Zip64 end of central directory locator. */
    /* This works if the entire PHYSFS_Io is the zip file. */
    BAIL_IF_ERRPASS(!io->seek(io, offset), -1);
    BAIL_IF_ERRPASS(!readui32(io, &ui32), -1);
    if (ui32 == ZIP64_END_OF_CENTRAL_DIR_SIG)
        return offset;

    /* Try 56 bytes before the Zip64 end of central directory locator. */
    /* This works if the record isn't variable length and is version 1. */
    if (pos > 56)
    {
        BAIL_IF_ERRPASS(!io->seek(io, pos-56), -1);
        BAIL_IF_ERRPASS(!readui32(io, &ui32), -1);
        if (ui32 == ZIP64_END_OF_CENTRAL_DIR_SIG)
            return pos-56;
    } /* if */

    /* Try 84 bytes before the Zip64 end of central directory locator. */
    /* This works if the record isn't variable length and is version 2. */
    if (pos > 84)
    {
        BAIL_IF_ERRPASS(!io->seek(io, pos-84), -1);
        BAIL_IF_ERRPASS(!readui32(io, &ui32), -1);
        if (ui32 == ZIP64_END_OF_CENTRAL_DIR_SIG)
            return pos-84;
    } /* if */

    /* Ok, brute force: we know it's between (offset) and (pos) somewhere. */
    /*  Just try moving back at most 256k. Oh well. */
    if ((offset < pos) && (pos > 4))
    {
        const size_t maxbuflen = 256 * 1024;
        size_t len = (size_t) (pos - offset);
        PHYSFS_uint8 *buf = NULL;
        PHYSFS_sint32 i;

        if (len > maxbuflen)
            len = maxbuflen;

        buf = (PHYSFS_uint8 *) __PHYSFS_smallAlloc(len);
        BAIL_IF(!buf, PHYSFS_ERR_OUT_OF_MEMORY, -1);

        if (!io->seek(io, pos - len) || !__PHYSFS_readAll(io, buf, len))
        {
            __PHYSFS_smallFree(buf);
            return -1;  /* error was set elsewhere. */
        } /* if */

        for (i = (PHYSFS_sint32) (len - 4); i >= 0; i--)
        {
            if ( (buf[i] == 0x50) && (buf[i+1] == 0x4b) &&
                 (buf[i+2] == 0x06) && (buf[i+3] == 0x06) )
            {
                __PHYSFS_smallFree(buf);
                return pos - ((PHYSFS_sint64) (len - i));
            } /* if */
        } /* for */

        __PHYSFS_smallFree(buf);
    } /* if */

    BAIL(PHYSFS_ERR_CORRUPT, -1);  /* didn't find it. */
}